

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.h
# Opt level: O2

void TRM::LinkedList<TRM::Vertex>::Remove<&TRM::Vertex::prev,&TRM::Vertex::next>
               (Vertex *t,Vertex **head,Vertex **tail)

{
  Vertex *pVVar1;
  Vertex *pVVar2;
  
  if (*(long *)(t + 8) == 0) {
    pVVar1 = *(Vertex **)(t + 0x10);
    if (head != (Vertex **)0x0) {
      *head = pVVar1;
    }
  }
  else {
    pVVar1 = *(Vertex **)(t + 0x10);
    *(Vertex **)(*(long *)(t + 8) + 0x10) = pVVar1;
  }
  pVVar2 = t + 8;
  if (pVVar1 == (Vertex *)0x0) {
    if (tail != (Vertex **)0x0) {
      *tail = *(Vertex **)pVVar2;
    }
  }
  else {
    *(undefined8 *)(pVVar1 + 8) = *(undefined8 *)pVVar2;
  }
  *(undefined8 *)pVVar2 = 0;
  *(undefined8 *)(t + 0x10) = 0;
  return;
}

Assistant:

static void Remove(T* t, T** head, T** tail) {
    if (t->*Prev) {
      t->*Prev->*Next = t->*Next;
    } else if (head) {
      *head = t->*Next;
    }

    if (t->*Next) {
      t->*Next->*Prev = t->*Prev;
    } else if (tail) {
      *tail = t->*Prev;
    }

    t->*Prev = t->*Next = nullptr;
  }